

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PVector * NewVector(uint size)

{
  PType *type;
  size_t bucket;
  size_t local_20;
  
  type = FTypeTable::FindType
                   (&TypeTable,PVector::RegistrationInfo.MyClass,(intptr_t)TypeFloat32,(ulong)size,
                    &local_20);
  if (type == (PType *)0x0) {
    type = (PType *)M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                                 ,0x1f7);
    PVector::PVector((PVector *)type,size);
    FTypeTable::AddType(&TypeTable,type,PVector::RegistrationInfo.MyClass,(intptr_t)TypeFloat32,
                        (ulong)size,local_20);
  }
  return (PVector *)type;
}

Assistant:

PVector *NewVector(unsigned int size)
{
	size_t bucket;
	PType *type = TypeTable.FindType(RUNTIME_CLASS(PVector), (intptr_t)TypeFloat32, size, &bucket);
	if (type == NULL)
	{
		type = new PVector(size);
		TypeTable.AddType(type, RUNTIME_CLASS(PVector), (intptr_t)TypeFloat32, size, bucket);
	}
	return (PVector *)type;
}